

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx::SubdivPatch1IntersectorK<4>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray,
              TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  RTCFilterFunctionN p_Var4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  ulong *puVar61;
  ulong uVar62;
  ulong uVar63;
  GridSOA *pGVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  long lVar68;
  int iVar69;
  ulong uVar70;
  uint uVar71;
  Geometry *pGVar72;
  char *pcVar73;
  ulong uVar74;
  ulong uVar75;
  undefined4 uVar76;
  ulong unaff_R15;
  size_t mask;
  float fVar77;
  float fVar84;
  float fVar85;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar81 [32];
  float fVar86;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  float fVar95;
  float fVar96;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar93 [32];
  float fVar97;
  undefined1 auVar94 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar109;
  undefined1 auVar111 [16];
  float fVar115;
  float fVar116;
  undefined1 auVar110 [16];
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar160;
  float fVar161;
  float fVar167;
  float fVar169;
  undefined1 auVar162 [16];
  float fVar168;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar166 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar176;
  float fVar179;
  float fVar180;
  undefined1 auVar177 [16];
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  undefined1 auVar178 [32];
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar190;
  float fVar191;
  float fVar192;
  undefined1 auVar188 [16];
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 auVar189 [32];
  float fVar197;
  float fVar198;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  undefined1 auVar199 [16];
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined8 local_bf0;
  undefined8 uStack_be8;
  undefined1 (*local_be0) [16];
  ulong local_bd8;
  ulong *local_bd0;
  ulong *local_bc8;
  undefined1 local_bc0 [32];
  undefined1 local_ba0 [32];
  char *local_b68;
  ulong local_b60;
  ulong local_b58;
  RTCFilterFunctionNArguments local_b50;
  Geometry *local_b20;
  undefined1 auStack_b18 [24];
  undefined1 local_b00 [16];
  undefined1 auStack_af0 [16];
  undefined1 local_ae0 [16];
  undefined1 auStack_ad0 [16];
  undefined1 local_ac0 [16];
  undefined1 auStack_ab0 [16];
  undefined4 local_a90;
  undefined4 uStack_a8c;
  undefined4 uStack_a88;
  undefined4 uStack_a84;
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined4 local_a60;
  undefined4 uStack_a5c;
  undefined4 uStack_a58;
  undefined4 uStack_a54;
  undefined1 local_a50 [16];
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined1 local_a30 [16];
  uint local_a20;
  uint uStack_a1c;
  uint uStack_a18;
  uint uStack_a14;
  uint uStack_a10;
  uint uStack_a0c;
  uint uStack_a08;
  uint uStack_a04;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined1 local_9e0 [32];
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  char **local_9a0;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  float local_940 [4];
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  size_t local_800;
  ulong local_7f8 [249];
  undefined1 auVar124 [24];
  undefined1 auVar125 [32];
  undefined1 auVar163 [16];
  undefined1 auVar164 [24];
  undefined1 auVar165 [32];
  
  local_800 = root.ptr;
  uVar76 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar177._4_4_ = uVar76;
  auVar177._0_4_ = uVar76;
  auVar177._8_4_ = uVar76;
  auVar177._12_4_ = uVar76;
  uVar76 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar188._4_4_ = uVar76;
  auVar188._0_4_ = uVar76;
  auVar188._8_4_ = uVar76;
  auVar188._12_4_ = uVar76;
  uVar76 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar199._4_4_ = uVar76;
  auVar199._0_4_ = uVar76;
  auVar199._8_4_ = uVar76;
  auVar199._12_4_ = uVar76;
  fVar77 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar84 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar85 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar121 = ZEXT416((uint)(fVar77 * 0.99999964));
  auVar121 = vshufps_avx(auVar121,auVar121,0);
  auVar122 = ZEXT416((uint)(fVar84 * 0.99999964));
  auVar122 = vshufps_avx(auVar122,auVar122,0);
  auVar110 = ZEXT416((uint)(fVar85 * 0.99999964));
  auVar110 = vshufps_avx(auVar110,auVar110,0);
  auVar78 = ZEXT416((uint)(fVar77 * 1.0000004));
  auVar78 = vshufps_avx(auVar78,auVar78,0);
  auVar79 = ZEXT416((uint)(fVar84 * 1.0000004));
  auVar79 = vshufps_avx(auVar79,auVar79,0);
  auVar80 = ZEXT416((uint)(fVar85 * 1.0000004));
  auVar80 = vshufps_avx(auVar80,auVar80,0);
  uVar74 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar67 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar66 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar75 = uVar74 ^ 0x10;
  iVar69 = (tray->tnear).field_0.i[k];
  auVar162._4_4_ = iVar69;
  auVar162._0_4_ = iVar69;
  auVar162._8_4_ = iVar69;
  auVar162._12_4_ = iVar69;
  iVar69 = (tray->tfar).field_0.i[k];
  auVar174._4_4_ = iVar69;
  auVar174._0_4_ = iVar69;
  auVar174._8_4_ = iVar69;
  auVar174._12_4_ = iVar69;
  local_be0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  puVar61 = local_7f8;
  local_bd8 = uVar74;
  do {
    local_bc8 = puVar61;
    if (local_bc8 == &local_800) break;
    local_bd0 = local_bc8 + -1;
    uVar63 = local_bc8[-1];
    do {
      if ((uVar63 & 8) == 0) {
        auVar123 = vsubps_avx(*(undefined1 (*) [16])(uVar63 + 0x20 + uVar74),auVar177);
        auVar111._0_4_ = auVar121._0_4_ * auVar123._0_4_;
        auVar111._4_4_ = auVar121._4_4_ * auVar123._4_4_;
        auVar111._8_4_ = auVar121._8_4_ * auVar123._8_4_;
        auVar111._12_4_ = auVar121._12_4_ * auVar123._12_4_;
        auVar123 = vsubps_avx(*(undefined1 (*) [16])(uVar63 + 0x20 + uVar67),auVar188);
        auVar90._0_4_ = auVar122._0_4_ * auVar123._0_4_;
        auVar90._4_4_ = auVar122._4_4_ * auVar123._4_4_;
        auVar90._8_4_ = auVar122._8_4_ * auVar123._8_4_;
        auVar90._12_4_ = auVar122._12_4_ * auVar123._12_4_;
        auVar123 = vmaxps_avx(auVar111,auVar90);
        auVar111 = vsubps_avx(*(undefined1 (*) [16])(uVar63 + 0x20 + uVar66),auVar199);
        auVar133._0_4_ = auVar110._0_4_ * auVar111._0_4_;
        auVar133._4_4_ = auVar110._4_4_ * auVar111._4_4_;
        auVar133._8_4_ = auVar110._8_4_ * auVar111._8_4_;
        auVar133._12_4_ = auVar110._12_4_ * auVar111._12_4_;
        auVar111 = vmaxps_avx(auVar133,auVar162);
        auVar123 = vmaxps_avx(auVar123,auVar111);
        auVar111 = vsubps_avx(*(undefined1 (*) [16])(uVar63 + 0x20 + uVar75),auVar177);
        auVar91._0_4_ = auVar78._0_4_ * auVar111._0_4_;
        auVar91._4_4_ = auVar78._4_4_ * auVar111._4_4_;
        auVar91._8_4_ = auVar78._8_4_ * auVar111._8_4_;
        auVar91._12_4_ = auVar78._12_4_ * auVar111._12_4_;
        auVar111 = vsubps_avx(*(undefined1 (*) [16])(uVar63 + 0x20 + (uVar67 ^ 0x10)),auVar188);
        auVar175._0_4_ = auVar79._0_4_ * auVar111._0_4_;
        auVar175._4_4_ = auVar79._4_4_ * auVar111._4_4_;
        auVar175._8_4_ = auVar79._8_4_ * auVar111._8_4_;
        auVar175._12_4_ = auVar79._12_4_ * auVar111._12_4_;
        auVar111 = vminps_avx(auVar91,auVar175);
        auVar90 = vsubps_avx(*(undefined1 (*) [16])(uVar63 + 0x20 + (uVar66 ^ 0x10)),auVar199);
        auVar101._0_4_ = auVar80._0_4_ * auVar90._0_4_;
        auVar101._4_4_ = auVar80._4_4_ * auVar90._4_4_;
        auVar101._8_4_ = auVar80._8_4_ * auVar90._8_4_;
        auVar101._12_4_ = auVar80._12_4_ * auVar90._12_4_;
        auVar90 = vminps_avx(auVar101,auVar174);
        auVar111 = vminps_avx(auVar111,auVar90);
        auVar123 = vcmpps_avx(auVar123,auVar111,2);
        uVar76 = vmovmskps_avx(auVar123);
        unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar76);
      }
      if ((uVar63 & 8) == 0) {
        if (unaff_R15 == 0) {
          uVar71 = 4;
        }
        else {
          uVar62 = uVar63 & 0xfffffffffffffff0;
          lVar68 = 0;
          if (unaff_R15 != 0) {
            for (; (unaff_R15 >> lVar68 & 1) == 0; lVar68 = lVar68 + 1) {
            }
          }
          uVar71 = 0;
          uVar63 = *(ulong *)(uVar62 + lVar68 * 8);
          uVar70 = unaff_R15 - 1 & unaff_R15;
          if (uVar70 != 0) {
            *local_bd0 = uVar63;
            lVar68 = 0;
            if (uVar70 != 0) {
              for (; (uVar70 >> lVar68 & 1) == 0; lVar68 = lVar68 + 1) {
              }
            }
            uVar65 = uVar70 - 1;
            while( true ) {
              local_bd0 = local_bd0 + 1;
              uVar63 = *(ulong *)(uVar62 + lVar68 * 8);
              uVar65 = uVar65 & uVar70;
              if (uVar65 == 0) break;
              *local_bd0 = uVar63;
              lVar68 = 0;
              if (uVar65 != 0) {
                for (; (uVar65 >> lVar68 & 1) == 0; lVar68 = lVar68 + 1) {
                }
              }
              uVar70 = uVar65 - 1;
            }
          }
        }
      }
      else {
        uVar71 = 6;
      }
    } while (uVar71 == 0);
    if (uVar71 == 6) {
      if (((uint)uVar63 & 0xf) == 8) {
        pGVar64 = (pre->super_Precalculations).grid;
        uVar71 = pGVar64->width;
        local_b60 = (ulong)uVar71;
        uVar2 = pGVar64->height;
        local_b58 = (ulong)uVar2;
        uVar3 = pGVar64->gridOffset;
        uVar63 = uVar63 >> 4;
        lVar68 = uVar63 * 4 + (ulong)uVar3;
        auVar123 = *(undefined1 (*) [16])(pGVar64->data + local_b60 * 4 + lVar68 + -4);
        auVar111 = auVar123;
        if (2 < local_b58) {
          auVar111 = *(undefined1 (*) [16])
                      (pGVar64->data + local_b60 * 8 + uVar63 * 4 + (ulong)uVar3 + -4);
        }
        auVar90 = *(undefined1 (*) [16])(pGVar64->data + uVar63 * 4 + (ulong)uVar3 + -4);
        if (local_b60 == 2) {
          auVar90 = vshufps_avx(auVar90,auVar90,0x54);
          auVar123 = vshufps_avx(auVar123,auVar123,0x54);
          auVar111 = vshufps_avx(auVar111,auVar111,0x54);
        }
        uVar74 = (ulong)pGVar64->dim_offset;
        pcVar73 = pGVar64->data + uVar74 * 4 + lVar68 + -4;
        auVar133 = *(undefined1 (*) [16])(pcVar73 + local_b60 * 4);
        auVar91 = auVar133;
        if (2 < uVar2) {
          auVar91 = *(undefined1 (*) [16])(pcVar73 + local_b60 * 8);
        }
        auVar175 = *(undefined1 (*) [16])pcVar73;
        if (uVar71 == 2) {
          auVar175 = vshufps_avx(auVar175,auVar175,0x54);
          auVar133 = vshufps_avx(auVar133,auVar133,0x54);
          auVar91 = vshufps_avx(auVar91,auVar91,0x54);
        }
        pcVar73 = pGVar64->data + uVar74 * 8 + lVar68 + -4;
        auVar101 = *(undefined1 (*) [16])(pcVar73 + local_b60 * 4);
        auVar163 = auVar101;
        if (2 < uVar2) {
          auVar163 = *(undefined1 (*) [16])(pcVar73 + local_b60 * 8);
        }
        auVar156._16_16_ = auVar123;
        auVar156._0_16_ = auVar90;
        auVar81._16_16_ = auVar111;
        auVar81._0_16_ = auVar123;
        auVar26 = vunpcklps_avx(auVar156,auVar81);
        auVar156 = vshufps_avx(auVar156,auVar156,0xa5);
        auVar81 = vshufps_avx(auVar81,auVar81,0x94);
        auVar129._16_16_ = auVar133;
        auVar129._0_16_ = auVar175;
        auVar157._16_16_ = auVar91;
        auVar157._0_16_ = auVar133;
        auVar27 = vunpcklps_avx(auVar129,auVar157);
        auVar129 = vshufps_avx(auVar129,auVar129,0xa5);
        auVar157 = vshufps_avx(auVar157,auVar157,0x94);
        auVar123 = *(undefined1 (*) [16])pcVar73;
        if (uVar71 == 2) {
          auVar123 = vshufps_avx(auVar123,auVar123,0x54);
          auVar101 = vshufps_avx(auVar101,auVar101,0x54);
          auVar163 = vshufps_avx(auVar163,auVar163,0x54);
        }
        local_b68 = pGVar64->data + uVar74 * 0xc + lVar68 + -4;
        auVar158._16_16_ = auVar101;
        auVar158._0_16_ = auVar123;
        auVar134._16_16_ = auVar163;
        auVar134._0_16_ = auVar101;
        auVar28 = vunpcklps_avx(auVar158,auVar134);
        auVar20 = vshufps_avx(auVar158,auVar158,0xa5);
        auVar21 = vshufps_avx(auVar134,auVar134,0x94);
        uVar76 = *(undefined4 *)(ray + k * 4);
        auVar135._4_4_ = uVar76;
        auVar135._0_4_ = uVar76;
        auVar135._8_4_ = uVar76;
        auVar135._12_4_ = uVar76;
        auVar135._16_4_ = uVar76;
        auVar135._20_4_ = uVar76;
        auVar135._24_4_ = uVar76;
        auVar135._28_4_ = uVar76;
        uVar76 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar178._4_4_ = uVar76;
        auVar178._0_4_ = uVar76;
        auVar178._8_4_ = uVar76;
        auVar178._12_4_ = uVar76;
        auVar178._16_4_ = uVar76;
        auVar178._20_4_ = uVar76;
        auVar178._24_4_ = uVar76;
        auVar178._28_4_ = uVar76;
        uVar76 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar189._4_4_ = uVar76;
        auVar189._0_4_ = uVar76;
        auVar189._8_4_ = uVar76;
        auVar189._12_4_ = uVar76;
        auVar189._16_4_ = uVar76;
        auVar189._20_4_ = uVar76;
        auVar189._24_4_ = uVar76;
        auVar189._28_4_ = uVar76;
        auVar26 = vsubps_avx(auVar26,auVar135);
        auVar27 = vsubps_avx(auVar27,auVar178);
        auVar28 = vsubps_avx(auVar28,auVar189);
        auVar156 = vsubps_avx(auVar156,auVar135);
        auVar129 = vsubps_avx(auVar129,auVar178);
        auVar22 = vsubps_avx(auVar20,auVar189);
        auVar81 = vsubps_avx(auVar81,auVar135);
        auVar157 = vsubps_avx(auVar157,auVar178);
        auVar23 = vsubps_avx(auVar21,auVar189);
        auVar134 = vsubps_avx(auVar81,auVar26);
        local_820 = vsubps_avx(auVar157,auVar27);
        local_840 = vsubps_avx(auVar23,auVar28);
        fVar5 = auVar27._0_4_;
        fVar77 = auVar157._0_4_ + fVar5;
        fVar8 = auVar27._4_4_;
        fVar84 = auVar157._4_4_ + fVar8;
        fVar97 = auVar27._8_4_;
        fVar85 = auVar157._8_4_ + fVar97;
        fVar100 = auVar27._12_4_;
        fVar86 = auVar157._12_4_ + fVar100;
        fVar11 = auVar27._16_4_;
        fVar87 = auVar157._16_4_ + fVar11;
        fVar14 = auVar27._20_4_;
        fVar88 = auVar157._20_4_ + fVar14;
        fVar17 = auVar27._24_4_;
        fVar89 = auVar157._24_4_ + fVar17;
        fVar6 = auVar28._0_4_;
        fVar138 = auVar23._0_4_ + fVar6;
        fVar95 = auVar28._4_4_;
        fVar143 = auVar23._4_4_ + fVar95;
        fVar98 = auVar28._8_4_;
        fVar145 = auVar23._8_4_ + fVar98;
        fVar9 = auVar28._12_4_;
        fVar147 = auVar23._12_4_ + fVar9;
        fVar12 = auVar28._16_4_;
        fVar149 = auVar23._16_4_ + fVar12;
        fVar15 = auVar28._20_4_;
        fVar151 = auVar23._20_4_ + fVar15;
        fVar18 = auVar28._24_4_;
        fVar153 = auVar23._24_4_ + fVar18;
        fVar139 = auVar28._28_4_;
        fVar155 = auVar23._28_4_ + fVar139;
        fVar197 = local_840._0_4_;
        fVar200 = local_840._4_4_;
        auVar24._4_4_ = fVar200 * fVar84;
        auVar24._0_4_ = fVar197 * fVar77;
        fVar202 = local_840._8_4_;
        auVar24._8_4_ = fVar202 * fVar85;
        fVar204 = local_840._12_4_;
        auVar24._12_4_ = fVar204 * fVar86;
        fVar206 = local_840._16_4_;
        auVar24._16_4_ = fVar206 * fVar87;
        fVar208 = local_840._20_4_;
        auVar24._20_4_ = fVar208 * fVar88;
        fVar210 = local_840._24_4_;
        auVar24._24_4_ = fVar210 * fVar89;
        auVar24._28_4_ = auVar20._28_4_;
        fVar212 = local_820._0_4_;
        fVar214 = local_820._4_4_;
        auVar20._4_4_ = fVar214 * fVar143;
        auVar20._0_4_ = fVar212 * fVar138;
        fVar216 = local_820._8_4_;
        auVar20._8_4_ = fVar216 * fVar145;
        fVar218 = local_820._12_4_;
        auVar20._12_4_ = fVar218 * fVar147;
        fVar220 = local_820._16_4_;
        auVar20._16_4_ = fVar220 * fVar149;
        fVar222 = local_820._20_4_;
        auVar20._20_4_ = fVar222 * fVar151;
        fVar224 = local_820._24_4_;
        auVar20._24_4_ = fVar224 * fVar153;
        auVar20._28_4_ = auVar21._28_4_;
        auVar20 = vsubps_avx(auVar20,auVar24);
        fVar7 = auVar26._0_4_;
        fVar160 = auVar81._0_4_ + fVar7;
        fVar96 = auVar26._4_4_;
        fVar167 = auVar81._4_4_ + fVar96;
        fVar99 = auVar26._8_4_;
        fVar169 = auVar81._8_4_ + fVar99;
        fVar10 = auVar26._12_4_;
        fVar170 = auVar81._12_4_ + fVar10;
        fVar13 = auVar26._16_4_;
        fVar171 = auVar81._16_4_ + fVar13;
        fVar16 = auVar26._20_4_;
        fVar172 = auVar81._20_4_ + fVar16;
        fVar19 = auVar26._24_4_;
        fVar173 = auVar81._24_4_ + fVar19;
        fVar176 = auVar134._0_4_;
        fVar179 = auVar134._4_4_;
        auVar25._4_4_ = fVar179 * fVar143;
        auVar25._0_4_ = fVar176 * fVar138;
        fVar180 = auVar134._8_4_;
        auVar25._8_4_ = fVar180 * fVar145;
        fVar181 = auVar134._12_4_;
        auVar25._12_4_ = fVar181 * fVar147;
        fVar182 = auVar134._16_4_;
        auVar25._16_4_ = fVar182 * fVar149;
        fVar183 = auVar134._20_4_;
        auVar25._20_4_ = fVar183 * fVar151;
        fVar184 = auVar134._24_4_;
        auVar25._24_4_ = fVar184 * fVar153;
        auVar25._28_4_ = fVar155;
        auVar29._4_4_ = fVar167 * fVar200;
        auVar29._0_4_ = fVar160 * fVar197;
        auVar29._8_4_ = fVar169 * fVar202;
        auVar29._12_4_ = fVar170 * fVar204;
        auVar29._16_4_ = fVar171 * fVar206;
        auVar29._20_4_ = fVar172 * fVar208;
        auVar29._24_4_ = fVar173 * fVar210;
        auVar29._28_4_ = auVar21._28_4_;
        auVar21 = vsubps_avx(auVar29,auVar25);
        auVar30._4_4_ = fVar167 * fVar214;
        auVar30._0_4_ = fVar160 * fVar212;
        auVar30._8_4_ = fVar169 * fVar216;
        auVar30._12_4_ = fVar170 * fVar218;
        auVar30._16_4_ = fVar171 * fVar220;
        auVar30._20_4_ = fVar172 * fVar222;
        auVar30._24_4_ = fVar173 * fVar224;
        auVar30._28_4_ = fVar155;
        auVar31._4_4_ = fVar179 * fVar84;
        auVar31._0_4_ = fVar176 * fVar77;
        auVar31._8_4_ = fVar180 * fVar85;
        auVar31._12_4_ = fVar181 * fVar86;
        auVar31._16_4_ = fVar182 * fVar87;
        auVar31._20_4_ = fVar183 * fVar88;
        auVar31._24_4_ = fVar184 * fVar89;
        auVar31._28_4_ = auVar157._28_4_ + auVar27._28_4_;
        auVar24 = vsubps_avx(auVar31,auVar30);
        fVar77 = *(float *)(ray + k * 4 + 0x50);
        fVar84 = *(float *)(ray + k * 4 + 0x60);
        fVar85 = *(float *)(ray + k * 4 + 0x40);
        fVar161 = fVar85 * auVar20._0_4_ + fVar77 * auVar21._0_4_ + auVar24._0_4_ * fVar84;
        fVar168 = fVar85 * auVar20._4_4_ + fVar77 * auVar21._4_4_ + auVar24._4_4_ * fVar84;
        auVar163._0_8_ = CONCAT44(fVar168,fVar161);
        auVar163._8_4_ = fVar85 * auVar20._8_4_ + fVar77 * auVar21._8_4_ + auVar24._8_4_ * fVar84;
        auVar163._12_4_ =
             fVar85 * auVar20._12_4_ + fVar77 * auVar21._12_4_ + auVar24._12_4_ * fVar84;
        auVar164._16_4_ =
             fVar85 * auVar20._16_4_ + fVar77 * auVar21._16_4_ + auVar24._16_4_ * fVar84;
        auVar164._0_16_ = auVar163;
        auVar164._20_4_ =
             fVar85 * auVar20._20_4_ + fVar77 * auVar21._20_4_ + auVar24._20_4_ * fVar84;
        auVar165._24_4_ =
             fVar85 * auVar20._24_4_ + fVar77 * auVar21._24_4_ + auVar24._24_4_ * fVar84;
        auVar165._0_24_ = auVar164;
        auVar165._28_4_ = auVar20._28_4_ + auVar21._28_4_ + auVar24._28_4_;
        local_860 = vsubps_avx(auVar27,auVar129);
        auVar20 = vsubps_avx(auVar28,auVar22);
        fVar88 = fVar5 + auVar129._0_4_;
        fVar89 = fVar8 + auVar129._4_4_;
        fVar138 = fVar97 + auVar129._8_4_;
        fVar143 = fVar100 + auVar129._12_4_;
        fVar145 = fVar11 + auVar129._16_4_;
        fVar147 = fVar14 + auVar129._20_4_;
        fVar149 = fVar17 + auVar129._24_4_;
        fVar86 = auVar129._28_4_;
        fVar151 = fVar6 + auVar22._0_4_;
        fVar153 = fVar95 + auVar22._4_4_;
        fVar155 = fVar98 + auVar22._8_4_;
        fVar160 = fVar9 + auVar22._12_4_;
        fVar167 = fVar12 + auVar22._16_4_;
        fVar169 = fVar15 + auVar22._20_4_;
        fVar170 = fVar18 + auVar22._24_4_;
        fVar87 = auVar22._28_4_;
        fVar213 = auVar20._0_4_;
        fVar215 = auVar20._4_4_;
        auVar32._4_4_ = fVar215 * fVar89;
        auVar32._0_4_ = fVar213 * fVar88;
        fVar217 = auVar20._8_4_;
        auVar32._8_4_ = fVar217 * fVar138;
        fVar219 = auVar20._12_4_;
        auVar32._12_4_ = fVar219 * fVar143;
        fVar221 = auVar20._16_4_;
        auVar32._16_4_ = fVar221 * fVar145;
        fVar223 = auVar20._20_4_;
        auVar32._20_4_ = fVar223 * fVar147;
        fVar225 = auVar20._24_4_;
        auVar32._24_4_ = fVar225 * fVar149;
        auVar32._28_4_ = auVar21._28_4_;
        fVar186 = local_860._0_4_;
        fVar190 = local_860._4_4_;
        auVar21._4_4_ = fVar190 * fVar153;
        auVar21._0_4_ = fVar186 * fVar151;
        fVar192 = local_860._8_4_;
        auVar21._8_4_ = fVar192 * fVar155;
        fVar193 = local_860._12_4_;
        auVar21._12_4_ = fVar193 * fVar160;
        fVar194 = local_860._16_4_;
        auVar21._16_4_ = fVar194 * fVar167;
        fVar195 = local_860._20_4_;
        auVar21._20_4_ = fVar195 * fVar169;
        fVar196 = local_860._24_4_;
        auVar21._24_4_ = fVar196 * fVar170;
        auVar21._28_4_ = fVar139;
        auVar20 = vsubps_avx(auVar21,auVar32);
        auVar21 = vsubps_avx(auVar26,auVar156);
        fVar198 = auVar21._0_4_;
        fVar201 = auVar21._4_4_;
        auVar33._4_4_ = fVar201 * fVar153;
        auVar33._0_4_ = fVar198 * fVar151;
        fVar203 = auVar21._8_4_;
        auVar33._8_4_ = fVar203 * fVar155;
        fVar205 = auVar21._12_4_;
        auVar33._12_4_ = fVar205 * fVar160;
        fVar207 = auVar21._16_4_;
        auVar33._16_4_ = fVar207 * fVar167;
        fVar209 = auVar21._20_4_;
        auVar33._20_4_ = fVar209 * fVar169;
        fVar211 = auVar21._24_4_;
        auVar33._24_4_ = fVar211 * fVar170;
        auVar33._28_4_ = fVar139 + fVar87;
        fVar139 = auVar156._0_4_ + fVar7;
        fVar151 = auVar156._4_4_ + fVar96;
        fVar153 = auVar156._8_4_ + fVar99;
        fVar155 = auVar156._12_4_ + fVar10;
        fVar160 = auVar156._16_4_ + fVar13;
        fVar167 = auVar156._20_4_ + fVar16;
        fVar169 = auVar156._24_4_ + fVar19;
        fVar185 = auVar156._28_4_;
        auVar34._4_4_ = fVar215 * fVar151;
        auVar34._0_4_ = fVar213 * fVar139;
        auVar34._8_4_ = fVar217 * fVar153;
        auVar34._12_4_ = fVar219 * fVar155;
        auVar34._16_4_ = fVar221 * fVar160;
        auVar34._20_4_ = fVar223 * fVar167;
        auVar34._24_4_ = fVar225 * fVar169;
        auVar34._28_4_ = fVar185;
        auVar21 = vsubps_avx(auVar34,auVar33);
        auVar35._4_4_ = fVar190 * fVar151;
        auVar35._0_4_ = fVar186 * fVar139;
        auVar35._8_4_ = fVar192 * fVar153;
        auVar35._12_4_ = fVar193 * fVar155;
        auVar35._16_4_ = fVar194 * fVar160;
        auVar35._20_4_ = fVar195 * fVar167;
        auVar35._24_4_ = fVar196 * fVar169;
        auVar35._28_4_ = fVar185 + auVar26._28_4_;
        auVar36._4_4_ = fVar201 * fVar89;
        auVar36._0_4_ = fVar198 * fVar88;
        auVar36._8_4_ = fVar203 * fVar138;
        auVar36._12_4_ = fVar205 * fVar143;
        auVar36._16_4_ = fVar207 * fVar145;
        auVar36._20_4_ = fVar209 * fVar147;
        auVar36._24_4_ = fVar211 * fVar149;
        auVar36._28_4_ = auVar27._28_4_ + fVar86;
        auVar24 = vsubps_avx(auVar36,auVar35);
        local_9e0._0_4_ = fVar85 * auVar20._0_4_ + auVar24._0_4_ * fVar84 + fVar77 * auVar21._0_4_;
        local_9e0._4_4_ = fVar85 * auVar20._4_4_ + auVar24._4_4_ * fVar84 + fVar77 * auVar21._4_4_;
        local_9e0._8_4_ = fVar85 * auVar20._8_4_ + auVar24._8_4_ * fVar84 + fVar77 * auVar21._8_4_;
        local_9e0._12_4_ =
             fVar85 * auVar20._12_4_ + auVar24._12_4_ * fVar84 + fVar77 * auVar21._12_4_;
        local_9e0._16_4_ =
             fVar85 * auVar20._16_4_ + auVar24._16_4_ * fVar84 + fVar77 * auVar21._16_4_;
        local_9e0._20_4_ =
             fVar85 * auVar20._20_4_ + auVar24._20_4_ * fVar84 + fVar77 * auVar21._20_4_;
        local_9e0._24_4_ =
             fVar85 * auVar20._24_4_ + auVar24._24_4_ * fVar84 + fVar77 * auVar21._24_4_;
        local_9e0._28_4_ = auVar21._28_4_ + auVar24._28_4_ + auVar21._28_4_;
        local_ba0 = vsubps_avx(auVar156,auVar81);
        fVar149 = auVar81._0_4_ + auVar156._0_4_;
        fVar151 = auVar81._4_4_ + auVar156._4_4_;
        fVar153 = auVar81._8_4_ + auVar156._8_4_;
        fVar155 = auVar81._12_4_ + auVar156._12_4_;
        fVar160 = auVar81._16_4_ + auVar156._16_4_;
        fVar167 = auVar81._20_4_ + auVar156._20_4_;
        fVar169 = auVar81._24_4_ + auVar156._24_4_;
        auVar20 = vsubps_avx(auVar129,auVar157);
        fVar170 = auVar129._0_4_ + auVar157._0_4_;
        fVar171 = auVar129._4_4_ + auVar157._4_4_;
        fVar172 = auVar129._8_4_ + auVar157._8_4_;
        fVar173 = auVar129._12_4_ + auVar157._12_4_;
        fVar105 = auVar129._16_4_ + auVar157._16_4_;
        fVar106 = auVar129._20_4_ + auVar157._20_4_;
        fVar107 = auVar129._24_4_ + auVar157._24_4_;
        fVar108 = fVar86 + auVar157._28_4_;
        auVar156 = vsubps_avx(auVar22,auVar23);
        fVar109 = auVar22._0_4_ + auVar23._0_4_;
        fVar115 = auVar22._4_4_ + auVar23._4_4_;
        fVar116 = auVar22._8_4_ + auVar23._8_4_;
        fVar117 = auVar22._12_4_ + auVar23._12_4_;
        fVar118 = auVar22._16_4_ + auVar23._16_4_;
        fVar119 = auVar22._20_4_ + auVar23._20_4_;
        fVar120 = auVar22._24_4_ + auVar23._24_4_;
        fVar139 = auVar156._0_4_;
        fVar88 = auVar156._4_4_;
        auVar22._4_4_ = fVar171 * fVar88;
        auVar22._0_4_ = fVar170 * fVar139;
        fVar89 = auVar156._8_4_;
        auVar22._8_4_ = fVar172 * fVar89;
        fVar138 = auVar156._12_4_;
        auVar22._12_4_ = fVar173 * fVar138;
        fVar143 = auVar156._16_4_;
        auVar22._16_4_ = fVar105 * fVar143;
        fVar145 = auVar156._20_4_;
        auVar22._20_4_ = fVar106 * fVar145;
        fVar147 = auVar156._24_4_;
        auVar22._24_4_ = fVar107 * fVar147;
        auVar22._28_4_ = fVar86;
        fVar140 = auVar20._0_4_;
        fVar144 = auVar20._4_4_;
        auVar37._4_4_ = fVar144 * fVar115;
        auVar37._0_4_ = fVar140 * fVar109;
        fVar146 = auVar20._8_4_;
        auVar37._8_4_ = fVar146 * fVar116;
        fVar148 = auVar20._12_4_;
        auVar37._12_4_ = fVar148 * fVar117;
        fVar150 = auVar20._16_4_;
        auVar37._16_4_ = fVar150 * fVar118;
        fVar152 = auVar20._20_4_;
        auVar37._20_4_ = fVar152 * fVar119;
        fVar154 = auVar20._24_4_;
        auVar37._24_4_ = fVar154 * fVar120;
        auVar37._28_4_ = fVar87;
        auVar156 = vsubps_avx(auVar37,auVar22);
        fVar187 = local_ba0._0_4_;
        fVar191 = local_ba0._4_4_;
        auVar38._4_4_ = fVar191 * fVar115;
        auVar38._0_4_ = fVar187 * fVar109;
        fVar109 = local_ba0._8_4_;
        auVar38._8_4_ = fVar109 * fVar116;
        fVar115 = local_ba0._12_4_;
        auVar38._12_4_ = fVar115 * fVar117;
        fVar116 = local_ba0._16_4_;
        auVar38._16_4_ = fVar116 * fVar118;
        fVar117 = local_ba0._20_4_;
        auVar38._20_4_ = fVar117 * fVar119;
        fVar118 = local_ba0._24_4_;
        auVar38._24_4_ = fVar118 * fVar120;
        auVar38._28_4_ = fVar87 + auVar23._28_4_;
        auVar23._4_4_ = fVar151 * fVar88;
        auVar23._0_4_ = fVar149 * fVar139;
        auVar23._8_4_ = fVar153 * fVar89;
        auVar23._12_4_ = fVar155 * fVar138;
        auVar23._16_4_ = fVar160 * fVar143;
        auVar23._20_4_ = fVar167 * fVar145;
        auVar23._24_4_ = fVar169 * fVar147;
        auVar23._28_4_ = fVar87;
        auVar129 = vsubps_avx(auVar23,auVar38);
        auVar39._4_4_ = fVar151 * fVar144;
        auVar39._0_4_ = fVar149 * fVar140;
        auVar39._8_4_ = fVar153 * fVar146;
        auVar39._12_4_ = fVar155 * fVar148;
        auVar39._16_4_ = fVar160 * fVar150;
        auVar39._20_4_ = fVar167 * fVar152;
        auVar39._24_4_ = fVar169 * fVar154;
        auVar39._28_4_ = auVar81._28_4_ + fVar185;
        auVar40._4_4_ = fVar191 * fVar171;
        auVar40._0_4_ = fVar187 * fVar170;
        auVar40._8_4_ = fVar109 * fVar172;
        auVar40._12_4_ = fVar115 * fVar173;
        auVar40._16_4_ = fVar116 * fVar105;
        auVar40._20_4_ = fVar117 * fVar106;
        auVar40._24_4_ = fVar118 * fVar107;
        auVar40._28_4_ = fVar108;
        auVar81 = vsubps_avx(auVar40,auVar39);
        auVar93._0_4_ = fVar85 * auVar156._0_4_ + auVar81._0_4_ * fVar84 + fVar77 * auVar129._0_4_;
        auVar93._4_4_ = fVar85 * auVar156._4_4_ + auVar81._4_4_ * fVar84 + fVar77 * auVar129._4_4_;
        auVar93._8_4_ = fVar85 * auVar156._8_4_ + auVar81._8_4_ * fVar84 + fVar77 * auVar129._8_4_;
        auVar93._12_4_ =
             fVar85 * auVar156._12_4_ + auVar81._12_4_ * fVar84 + fVar77 * auVar129._12_4_;
        auVar93._16_4_ =
             fVar85 * auVar156._16_4_ + auVar81._16_4_ * fVar84 + fVar77 * auVar129._16_4_;
        auVar93._20_4_ =
             fVar85 * auVar156._20_4_ + auVar81._20_4_ * fVar84 + fVar77 * auVar129._20_4_;
        auVar93._24_4_ =
             fVar85 * auVar156._24_4_ + auVar81._24_4_ * fVar84 + fVar77 * auVar129._24_4_;
        auVar93._28_4_ = fVar108 + auVar81._28_4_ + fVar108;
        fVar167 = auVar93._0_4_ + fVar161 + local_9e0._0_4_;
        fVar169 = auVar93._4_4_ + fVar168 + local_9e0._4_4_;
        auVar123._0_8_ = CONCAT44(fVar169,fVar167);
        auVar123._8_4_ = auVar93._8_4_ + auVar163._8_4_ + local_9e0._8_4_;
        auVar123._12_4_ = auVar93._12_4_ + auVar163._12_4_ + local_9e0._12_4_;
        auVar124._16_4_ = auVar93._16_4_ + auVar164._16_4_ + local_9e0._16_4_;
        auVar124._0_16_ = auVar123;
        auVar124._20_4_ = auVar93._20_4_ + auVar164._20_4_ + local_9e0._20_4_;
        auVar125._24_4_ = auVar93._24_4_ + auVar165._24_4_ + local_9e0._24_4_;
        auVar125._0_24_ = auVar124;
        auVar125._28_4_ = auVar93._28_4_ + auVar165._28_4_ + local_9e0._28_4_;
        auVar141._8_4_ = 0x7fffffff;
        auVar141._0_8_ = 0x7fffffff7fffffff;
        auVar141._12_4_ = 0x7fffffff;
        auVar141._16_4_ = 0x7fffffff;
        auVar141._20_4_ = 0x7fffffff;
        auVar141._24_4_ = 0x7fffffff;
        auVar141._28_4_ = 0x7fffffff;
        auVar156 = vandps_avx(auVar125,auVar141);
        fVar86 = auVar156._0_4_ * 1.1920929e-07;
        fVar87 = auVar156._4_4_ * 1.1920929e-07;
        auVar41._4_4_ = fVar87;
        auVar41._0_4_ = fVar86;
        fVar149 = auVar156._8_4_ * 1.1920929e-07;
        auVar41._8_4_ = fVar149;
        fVar151 = auVar156._12_4_ * 1.1920929e-07;
        auVar41._12_4_ = fVar151;
        fVar153 = auVar156._16_4_ * 1.1920929e-07;
        auVar41._16_4_ = fVar153;
        fVar155 = auVar156._20_4_ * 1.1920929e-07;
        auVar41._20_4_ = fVar155;
        uVar71 = auVar156._28_4_;
        fVar160 = auVar156._24_4_ * 1.1920929e-07;
        auVar41._24_4_ = fVar160;
        auVar41._28_4_ = uVar71;
        auVar156 = vminps_avx(auVar165,local_9e0);
        auVar156 = vminps_avx(auVar156,auVar93);
        auVar130._0_8_ = CONCAT44(fVar87,fVar86) ^ 0x8000000080000000;
        auVar130._8_4_ = -fVar149;
        auVar130._12_4_ = -fVar151;
        auVar130._16_4_ = -fVar153;
        auVar130._20_4_ = -fVar155;
        auVar130._24_4_ = -fVar160;
        auVar130._28_4_ = uVar71 ^ 0x80000000;
        auVar156 = vcmpps_avx(auVar156,auVar130,5);
        auVar129 = vmaxps_avx(auVar165,local_9e0);
        auVar81 = vmaxps_avx(auVar129,auVar93);
        auVar81 = vcmpps_avx(auVar81,auVar41,2);
        auVar81 = vorps_avx(auVar156,auVar81);
        if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar81 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar81 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar81 >> 0x7f,0) == '\0') &&
              (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar81 >> 0xbf,0) == '\0') &&
            (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar81[0x1f]) {
          uVar62 = 0;
        }
        else {
          local_880 = auVar125;
          auVar22 = local_880;
          local_8a0 = local_9e0;
          auVar42._4_4_ = fVar190 * fVar200;
          auVar42._0_4_ = fVar186 * fVar197;
          auVar42._8_4_ = fVar192 * fVar202;
          auVar42._12_4_ = fVar193 * fVar204;
          auVar42._16_4_ = fVar194 * fVar206;
          auVar42._20_4_ = fVar195 * fVar208;
          auVar42._24_4_ = fVar196 * fVar210;
          auVar42._28_4_ = uVar71;
          auVar43._4_4_ = fVar214 * fVar215;
          auVar43._0_4_ = fVar212 * fVar213;
          auVar43._8_4_ = fVar216 * fVar217;
          auVar43._12_4_ = fVar218 * fVar219;
          auVar43._16_4_ = fVar220 * fVar221;
          auVar43._20_4_ = fVar222 * fVar223;
          auVar43._24_4_ = fVar224 * fVar225;
          auVar43._28_4_ = auVar156._28_4_;
          auVar157 = vsubps_avx(auVar43,auVar42);
          auVar44._4_4_ = fVar215 * fVar144;
          auVar44._0_4_ = fVar213 * fVar140;
          auVar44._8_4_ = fVar217 * fVar146;
          auVar44._12_4_ = fVar219 * fVar148;
          auVar44._16_4_ = fVar221 * fVar150;
          auVar44._20_4_ = fVar223 * fVar152;
          auVar44._24_4_ = fVar225 * fVar154;
          auVar44._28_4_ = auVar129._28_4_;
          auVar45._4_4_ = fVar190 * fVar88;
          auVar45._0_4_ = fVar186 * fVar139;
          auVar45._8_4_ = fVar192 * fVar89;
          auVar45._12_4_ = fVar193 * fVar138;
          auVar45._16_4_ = fVar194 * fVar143;
          auVar45._20_4_ = fVar195 * fVar145;
          auVar45._24_4_ = fVar196 * fVar147;
          auVar45._28_4_ = auVar20._28_4_;
          auVar20 = vsubps_avx(auVar45,auVar44);
          auVar156 = vandps_avx(auVar42,auVar141);
          auVar129 = vandps_avx(auVar44,auVar141);
          auVar156 = vcmpps_avx(auVar156,auVar129,1);
          local_900 = vblendvps_avx(auVar20,auVar157,auVar156);
          auVar46._4_4_ = fVar201 * fVar88;
          auVar46._0_4_ = fVar198 * fVar139;
          auVar46._8_4_ = fVar203 * fVar89;
          auVar46._12_4_ = fVar205 * fVar138;
          auVar46._16_4_ = fVar207 * fVar143;
          auVar46._20_4_ = fVar209 * fVar145;
          auVar46._24_4_ = fVar211 * fVar147;
          auVar46._28_4_ = auVar156._28_4_;
          auVar47._4_4_ = fVar201 * fVar200;
          auVar47._0_4_ = fVar198 * fVar197;
          auVar47._8_4_ = fVar203 * fVar202;
          auVar47._12_4_ = fVar205 * fVar204;
          auVar47._16_4_ = fVar207 * fVar206;
          auVar47._20_4_ = fVar209 * fVar208;
          auVar47._24_4_ = fVar211 * fVar210;
          auVar47._28_4_ = auVar157._28_4_;
          auVar48._4_4_ = fVar215 * fVar179;
          auVar48._0_4_ = fVar213 * fVar176;
          auVar48._8_4_ = fVar217 * fVar180;
          auVar48._12_4_ = fVar219 * fVar181;
          auVar48._16_4_ = fVar221 * fVar182;
          auVar48._20_4_ = fVar223 * fVar183;
          auVar48._24_4_ = fVar225 * fVar184;
          auVar48._28_4_ = auVar125._28_4_;
          auVar157 = vsubps_avx(auVar47,auVar48);
          auVar49._4_4_ = fVar215 * fVar191;
          auVar49._0_4_ = fVar213 * fVar187;
          auVar49._8_4_ = fVar217 * fVar109;
          auVar49._12_4_ = fVar219 * fVar115;
          auVar49._16_4_ = fVar221 * fVar116;
          auVar49._20_4_ = fVar223 * fVar117;
          auVar49._24_4_ = fVar225 * fVar118;
          auVar49._28_4_ = auVar129._28_4_;
          auVar20 = vsubps_avx(auVar49,auVar46);
          auVar156 = vandps_avx(auVar48,auVar141);
          auVar129 = vandps_avx(auVar46,auVar141);
          auVar129 = vcmpps_avx(auVar156,auVar129,1);
          local_8e0 = vblendvps_avx(auVar20,auVar157,auVar129);
          auVar50._4_4_ = fVar190 * fVar191;
          auVar50._0_4_ = fVar186 * fVar187;
          auVar50._8_4_ = fVar192 * fVar109;
          auVar50._12_4_ = fVar193 * fVar115;
          auVar50._16_4_ = fVar194 * fVar116;
          auVar50._20_4_ = fVar195 * fVar117;
          auVar50._24_4_ = fVar196 * fVar118;
          auVar50._28_4_ = local_ba0._28_4_;
          auVar51._4_4_ = fVar190 * fVar179;
          auVar51._0_4_ = fVar186 * fVar176;
          auVar51._8_4_ = fVar192 * fVar180;
          auVar51._12_4_ = fVar193 * fVar181;
          auVar51._16_4_ = fVar194 * fVar182;
          auVar51._20_4_ = fVar195 * fVar183;
          auVar51._24_4_ = fVar196 * fVar184;
          auVar51._28_4_ = auVar129._28_4_;
          auVar52._4_4_ = fVar201 * fVar214;
          auVar52._0_4_ = fVar198 * fVar212;
          auVar52._8_4_ = fVar203 * fVar216;
          auVar52._12_4_ = fVar205 * fVar218;
          auVar52._16_4_ = fVar207 * fVar220;
          auVar52._20_4_ = fVar209 * fVar222;
          auVar52._24_4_ = fVar211 * fVar224;
          auVar52._28_4_ = auVar157._28_4_;
          auVar53._4_4_ = fVar201 * fVar144;
          auVar53._0_4_ = fVar198 * fVar140;
          auVar53._8_4_ = fVar203 * fVar146;
          auVar53._12_4_ = fVar205 * fVar148;
          auVar53._16_4_ = fVar207 * fVar150;
          auVar53._20_4_ = fVar209 * fVar152;
          auVar53._24_4_ = fVar211 * fVar154;
          auVar53._28_4_ = auVar156._28_4_;
          auVar157 = vsubps_avx(auVar51,auVar52);
          auVar21 = vsubps_avx(auVar53,auVar50);
          auVar156 = vandps_avx(auVar52,auVar141);
          auVar129 = vandps_avx(auVar50,auVar141);
          auVar129 = vcmpps_avx(auVar156,auVar129,1);
          local_8c0 = vblendvps_avx(auVar21,auVar157,auVar129);
          auVar111 = vpackssdw_avx(auVar81._0_16_,auVar81._16_16_);
          fVar139 = auVar156._28_4_;
          fVar86 = fVar85 * local_900._0_4_ + local_8c0._0_4_ * fVar84 + local_8e0._0_4_ * fVar77;
          fVar87 = fVar85 * local_900._4_4_ + local_8c0._4_4_ * fVar84 + local_8e0._4_4_ * fVar77;
          fVar88 = fVar85 * local_900._8_4_ + local_8c0._8_4_ * fVar84 + local_8e0._8_4_ * fVar77;
          fVar89 = fVar85 * local_900._12_4_ + local_8c0._12_4_ * fVar84 + local_8e0._12_4_ * fVar77
          ;
          fVar138 = fVar85 * local_900._16_4_ +
                    local_8c0._16_4_ * fVar84 + local_8e0._16_4_ * fVar77;
          fVar143 = fVar85 * local_900._20_4_ +
                    local_8c0._20_4_ * fVar84 + local_8e0._20_4_ * fVar77;
          fVar77 = fVar85 * local_900._24_4_ + local_8c0._24_4_ * fVar84 + local_8e0._24_4_ * fVar77
          ;
          fVar84 = fVar139 + auVar81._28_4_ + fVar139;
          auVar126._0_4_ = fVar86 + fVar86;
          auVar126._4_4_ = fVar87 + fVar87;
          auVar126._8_4_ = fVar88 + fVar88;
          auVar126._12_4_ = fVar89 + fVar89;
          auVar126._16_4_ = fVar138 + fVar138;
          auVar126._20_4_ = fVar143 + fVar143;
          auVar126._24_4_ = fVar77 + fVar77;
          auVar126._28_4_ = fVar84 + fVar84;
          fVar86 = local_900._0_4_ * fVar7 + local_8c0._0_4_ * fVar6 + local_8e0._0_4_ * fVar5;
          fVar95 = local_900._4_4_ * fVar96 + local_8c0._4_4_ * fVar95 + local_8e0._4_4_ * fVar8;
          fVar96 = local_900._8_4_ * fVar99 + local_8c0._8_4_ * fVar98 + local_8e0._8_4_ * fVar97;
          fVar97 = local_900._12_4_ * fVar10 + local_8c0._12_4_ * fVar9 + local_8e0._12_4_ * fVar100
          ;
          fVar98 = local_900._16_4_ * fVar13 + local_8c0._16_4_ * fVar12 + local_8e0._16_4_ * fVar11
          ;
          fVar99 = local_900._20_4_ * fVar16 + local_8c0._20_4_ * fVar15 + local_8e0._20_4_ * fVar14
          ;
          fVar100 = local_900._24_4_ * fVar19 +
                    local_8c0._24_4_ * fVar18 + local_8e0._24_4_ * fVar17;
          fVar139 = fVar139 + fVar84 + fVar139;
          auVar156 = vrcpps_avx(auVar126);
          fVar77 = auVar156._0_4_;
          fVar84 = auVar156._4_4_;
          auVar54._4_4_ = auVar126._4_4_ * fVar84;
          auVar54._0_4_ = auVar126._0_4_ * fVar77;
          fVar85 = auVar156._8_4_;
          auVar54._8_4_ = auVar126._8_4_ * fVar85;
          fVar5 = auVar156._12_4_;
          auVar54._12_4_ = auVar126._12_4_ * fVar5;
          fVar6 = auVar156._16_4_;
          auVar54._16_4_ = auVar126._16_4_ * fVar6;
          fVar7 = auVar156._20_4_;
          auVar54._20_4_ = auVar126._20_4_ * fVar7;
          fVar8 = auVar156._24_4_;
          auVar54._24_4_ = auVar126._24_4_ * fVar8;
          auVar54._28_4_ = auVar20._28_4_;
          auVar136._8_4_ = 0x3f800000;
          auVar136._0_8_ = &DAT_3f8000003f800000;
          auVar136._12_4_ = 0x3f800000;
          auVar136._16_4_ = 0x3f800000;
          auVar136._20_4_ = 0x3f800000;
          auVar136._24_4_ = 0x3f800000;
          auVar136._28_4_ = 0x3f800000;
          auVar156 = vsubps_avx(auVar136,auVar54);
          local_920._4_4_ = (fVar95 + fVar95) * (fVar84 + fVar84 * auVar156._4_4_);
          local_920._0_4_ = (fVar86 + fVar86) * (fVar77 + fVar77 * auVar156._0_4_);
          local_920._8_4_ = (fVar96 + fVar96) * (fVar85 + fVar85 * auVar156._8_4_);
          local_920._12_4_ = (fVar97 + fVar97) * (fVar5 + fVar5 * auVar156._12_4_);
          local_920._16_4_ = (fVar98 + fVar98) * (fVar6 + fVar6 * auVar156._16_4_);
          local_920._20_4_ = (fVar99 + fVar99) * (fVar7 + fVar7 * auVar156._20_4_);
          local_920._24_4_ = (fVar100 + fVar100) * (fVar8 + fVar8 * auVar156._24_4_);
          local_920._28_4_ = fVar139 + fVar139;
          uVar76 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar112._4_4_ = uVar76;
          auVar112._0_4_ = uVar76;
          auVar112._8_4_ = uVar76;
          auVar112._12_4_ = uVar76;
          auVar112._16_4_ = uVar76;
          auVar112._20_4_ = uVar76;
          auVar112._24_4_ = uVar76;
          auVar112._28_4_ = uVar76;
          auVar156 = vcmpps_avx(auVar112,local_920,2);
          uVar76 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar131._4_4_ = uVar76;
          auVar131._0_4_ = uVar76;
          auVar131._8_4_ = uVar76;
          auVar131._12_4_ = uVar76;
          auVar131._16_4_ = uVar76;
          auVar131._20_4_ = uVar76;
          auVar131._24_4_ = uVar76;
          auVar131._28_4_ = uVar76;
          auVar81 = vcmpps_avx(local_920,auVar131,2);
          auVar156 = vandps_avx(auVar81,auVar156);
          auVar90 = vpackssdw_avx(auVar156._0_16_,auVar156._16_16_);
          auVar111 = vpand_avx(auVar90,auVar111);
          auVar90 = vpmovsxwd_avx(auVar111);
          auVar133 = vpshufd_avx(auVar111,0xee);
          auVar133 = vpmovsxwd_avx(auVar133);
          auVar113._16_16_ = auVar133;
          auVar113._0_16_ = auVar90;
          if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar113 >> 0x7f,0) == '\0') &&
                (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar133 >> 0x3f,0) == '\0') &&
              (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar133[0xf]) {
            uVar62 = 0;
          }
          else {
            local_880._8_8_ = auVar123._8_8_;
            local_880._16_8_ = auVar124._16_8_;
            local_880._24_8_ = auVar125._24_8_;
            auVar156 = vcmpps_avx(auVar126,_DAT_02020f00,4);
            auVar90 = vpackssdw_avx(auVar156._0_16_,auVar156._16_16_);
            auVar111 = vpand_avx(auVar111,auVar90);
            auVar90 = vpmovsxwd_avx(auVar111);
            auVar111 = vpunpckhwd_avx(auVar111,auVar111);
            local_980._16_16_ = auVar111;
            local_980._0_16_ = auVar90;
            if ((((((((local_980 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_980 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_980 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_980 >> 0x7f,0) != '\0') ||
                  (local_980 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB161(auVar111 >> 0x3f,0) != '\0') ||
                (local_980 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar111[0xf] < '\0') {
              local_bc0._8_8_ = auVar163._8_8_;
              local_bc0._16_8_ = auVar164._16_8_;
              local_bc0._24_8_ = auVar165._24_8_;
              uStack_9f8 = local_bc0._8_8_;
              uStack_9f0 = local_bc0._16_8_;
              uStack_9e8 = local_bc0._24_8_;
              uStack_9b8 = local_880._8_8_;
              uStack_9b0 = local_880._16_8_;
              uStack_9a8 = local_880._24_8_;
              local_9a0 = &local_b68;
              pGVar72 = (context->scene->geometries).items[pGVar64->_geomID].ptr;
              if ((pGVar72->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (uVar62 = 1, pGVar72->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar60._16_8_ = local_880._16_8_;
                  auVar60._0_16_ = auVar123;
                  auVar60._24_8_ = local_880._24_8_;
                  auVar94._8_4_ = 0x7fffffff;
                  auVar94._0_8_ = 0x7fffffff7fffffff;
                  auVar94._12_4_ = 0x7fffffff;
                  auVar94._16_4_ = 0x7fffffff;
                  auVar94._20_4_ = 0x7fffffff;
                  auVar94._24_4_ = 0x7fffffff;
                  auVar94._28_4_ = 0x7fffffff;
                  auVar156 = vandps_avx(auVar60,auVar94);
                  auVar103._8_4_ = 0x219392ef;
                  auVar103._0_8_ = 0x219392ef219392ef;
                  auVar103._12_4_ = 0x219392ef;
                  auVar103._16_4_ = 0x219392ef;
                  auVar103._20_4_ = 0x219392ef;
                  auVar103._24_4_ = 0x219392ef;
                  auVar103._28_4_ = 0x219392ef;
                  auVar156 = vcmpps_avx(auVar156,auVar103,5);
                  auVar81 = vrcpps_avx(auVar60);
                  fVar77 = auVar81._0_4_;
                  fVar84 = auVar81._4_4_;
                  auVar55._4_4_ = fVar169 * fVar84;
                  auVar55._0_4_ = fVar167 * fVar77;
                  fVar85 = auVar81._8_4_;
                  auVar55._8_4_ = auVar123._8_4_ * fVar85;
                  fVar5 = auVar81._12_4_;
                  auVar55._12_4_ = auVar123._12_4_ * fVar5;
                  fVar6 = auVar81._16_4_;
                  auVar55._16_4_ = auVar124._16_4_ * fVar6;
                  fVar7 = auVar81._20_4_;
                  auVar55._20_4_ = auVar124._20_4_ * fVar7;
                  fVar8 = auVar81._24_4_;
                  auVar55._24_4_ = auVar125._24_4_ * fVar8;
                  auVar55._28_4_ = auVar125._28_4_;
                  auVar114._8_4_ = 0x3f800000;
                  auVar114._0_8_ = &DAT_3f8000003f800000;
                  auVar114._12_4_ = 0x3f800000;
                  auVar114._16_4_ = 0x3f800000;
                  auVar114._20_4_ = 0x3f800000;
                  auVar114._24_4_ = 0x3f800000;
                  auVar114._28_4_ = 0x3f800000;
                  auVar129 = vsubps_avx(auVar114,auVar55);
                  auVar82._0_4_ = fVar77 + fVar77 * auVar129._0_4_;
                  auVar82._4_4_ = fVar84 + fVar84 * auVar129._4_4_;
                  auVar82._8_4_ = fVar85 + fVar85 * auVar129._8_4_;
                  auVar82._12_4_ = fVar5 + fVar5 * auVar129._12_4_;
                  auVar82._16_4_ = fVar6 + fVar6 * auVar129._16_4_;
                  auVar82._20_4_ = fVar7 + fVar7 * auVar129._20_4_;
                  auVar82._24_4_ = fVar8 + fVar8 * auVar129._24_4_;
                  auVar82._28_4_ = auVar81._28_4_ + auVar129._28_4_;
                  auVar156 = vandps_avx(auVar156,auVar82);
                  auVar56._4_4_ = auVar156._4_4_ * fVar168;
                  auVar56._0_4_ = auVar156._0_4_ * fVar161;
                  auVar56._8_4_ = auVar156._8_4_ * auVar163._8_4_;
                  auVar56._12_4_ = auVar156._12_4_ * auVar163._12_4_;
                  auVar56._16_4_ = auVar156._16_4_ * auVar164._16_4_;
                  auVar56._20_4_ = auVar156._20_4_ * auVar164._20_4_;
                  auVar56._24_4_ = auVar156._24_4_ * auVar165._24_4_;
                  auVar56._28_4_ = auVar82._28_4_;
                  auVar81 = vminps_avx(auVar56,auVar114);
                  auVar57._4_4_ = auVar156._4_4_ * local_9e0._4_4_;
                  auVar57._0_4_ = auVar156._0_4_ * local_9e0._0_4_;
                  auVar57._8_4_ = auVar156._8_4_ * local_9e0._8_4_;
                  auVar57._12_4_ = auVar156._12_4_ * local_9e0._12_4_;
                  auVar57._16_4_ = auVar156._16_4_ * local_9e0._16_4_;
                  auVar57._20_4_ = auVar156._20_4_ * local_9e0._20_4_;
                  auVar57._24_4_ = auVar156._24_4_ * local_9e0._24_4_;
                  auVar57._28_4_ = auVar156._28_4_;
                  auVar156 = vminps_avx(auVar57,auVar114);
                  auVar111 = *(undefined1 (*) [16])(local_b68 + local_b60 * 4);
                  auVar90 = auVar111;
                  if (2 < local_b58) {
                    auVar90 = *(undefined1 (*) [16])(local_b68 + local_b60 * 8);
                  }
                  auVar133 = *(undefined1 (*) [16])local_b68;
                  if (local_b60 == 2) {
                    auVar133 = vpshufd_avx(auVar133,0x54);
                    auVar111 = vpshufd_avx(auVar111,0x54);
                    auVar90 = vpshufd_avx(auVar90,0x54);
                  }
                  auVar132._16_16_ = auVar111;
                  auVar132._0_16_ = auVar133;
                  auVar137._16_16_ = auVar90;
                  auVar137._0_16_ = auVar111;
                  auVar129 = vunpcklps_avx(auVar132,auVar137);
                  auVar133 = vpshufd_avx(auVar133,0xa5);
                  auVar91 = vpshufd_avx(auVar111,0xa5);
                  auVar142._16_16_ = auVar91;
                  auVar142._0_16_ = auVar133;
                  auVar111 = vpshufd_avx(auVar111,0x94);
                  auVar90 = vpshufd_avx(auVar90,0x94);
                  auVar83._16_16_ = auVar90;
                  auVar83._0_16_ = auVar111;
                  auVar166._0_16_ = vpsrld_avx(auVar129._0_16_,0x10);
                  auVar175 = vpsrld_avx(auVar129._16_16_,0x10);
                  auVar159._8_4_ = 0xffff;
                  auVar159._0_8_ = 0xffff0000ffff;
                  auVar159._12_4_ = 0xffff;
                  auVar159._16_4_ = 0xffff;
                  auVar159._20_4_ = 0xffff;
                  auVar159._24_4_ = 0xffff;
                  auVar159._28_4_ = 0xffff;
                  auVar129 = vandps_avx(auVar159,auVar129);
                  auVar157 = vcvtdq2ps_avx(auVar129);
                  auVar166._16_16_ = auVar175;
                  auVar20 = vcvtdq2ps_avx(auVar166);
                  auVar127._0_16_ = vpsrld_avx(auVar133,0x10);
                  auVar133 = vpsrld_avx(auVar91,0x10);
                  auVar129 = vandps_avx(auVar159,auVar142);
                  auVar21 = vcvtdq2ps_avx(auVar129);
                  auVar127._16_16_ = auVar133;
                  auVar23 = vcvtdq2ps_avx(auVar127);
                  auVar104._0_16_ = vpsrld_avx(auVar111,0x10);
                  auVar111 = vpsrld_avx(auVar90,0x10);
                  auVar129 = vandps_avx(auVar159,auVar83);
                  auVar129 = vcvtdq2ps_avx(auVar129);
                  auVar104._16_16_ = auVar111;
                  auVar24 = vcvtdq2ps_avx(auVar104);
                  auVar128._8_4_ = 0x3f800000;
                  auVar128._0_8_ = &DAT_3f8000003f800000;
                  auVar128._12_4_ = 0x3f800000;
                  auVar128._16_4_ = 0x3f800000;
                  auVar128._20_4_ = 0x3f800000;
                  auVar128._24_4_ = 0x3f800000;
                  auVar128._28_4_ = 0x3f800000;
                  auVar25 = vsubps_avx(auVar128,auVar81);
                  auVar25 = vsubps_avx(auVar25,auVar156);
                  local_960._0_4_ =
                       auVar156._0_4_ * auVar129._0_4_ * 0.00012207031 +
                       auVar81._0_4_ * auVar21._0_4_ * 0.00012207031 +
                       auVar25._0_4_ * auVar157._0_4_ * 0.00012207031;
                  local_960._4_4_ =
                       auVar156._4_4_ * auVar129._4_4_ * 0.00012207031 +
                       auVar81._4_4_ * auVar21._4_4_ * 0.00012207031 +
                       auVar25._4_4_ * auVar157._4_4_ * 0.00012207031;
                  local_960._8_4_ =
                       auVar156._8_4_ * auVar129._8_4_ * 0.00012207031 +
                       auVar81._8_4_ * auVar21._8_4_ * 0.00012207031 +
                       auVar25._8_4_ * auVar157._8_4_ * 0.00012207031;
                  local_960._12_4_ =
                       auVar156._12_4_ * auVar129._12_4_ * 0.00012207031 +
                       auVar81._12_4_ * auVar21._12_4_ * 0.00012207031 +
                       auVar25._12_4_ * auVar157._12_4_ * 0.00012207031;
                  local_960._16_4_ =
                       auVar156._16_4_ * auVar129._16_4_ * 0.00012207031 +
                       auVar81._16_4_ * auVar21._16_4_ * 0.00012207031 +
                       auVar25._16_4_ * auVar157._16_4_ * 0.00012207031;
                  local_960._20_4_ =
                       auVar156._20_4_ * auVar129._20_4_ * 0.00012207031 +
                       auVar81._20_4_ * auVar21._20_4_ * 0.00012207031 +
                       auVar25._20_4_ * auVar157._20_4_ * 0.00012207031;
                  local_960._24_4_ =
                       auVar156._24_4_ * auVar129._24_4_ * 0.00012207031 +
                       auVar81._24_4_ * auVar21._24_4_ * 0.00012207031 +
                       auVar25._24_4_ * auVar157._24_4_ * 0.00012207031;
                  local_960._28_4_ = auVar129._28_4_ + 0.0 + auVar156._28_4_;
                  local_940[1] = auVar156._4_4_ * auVar24._4_4_ * 0.00012207031 +
                                 auVar81._4_4_ * auVar23._4_4_ * 0.00012207031 +
                                 auVar20._4_4_ * 0.00012207031 * auVar25._4_4_;
                  local_940[0] = auVar156._0_4_ * auVar24._0_4_ * 0.00012207031 +
                                 auVar81._0_4_ * auVar23._0_4_ * 0.00012207031 +
                                 auVar20._0_4_ * 0.00012207031 * auVar25._0_4_;
                  local_940[2] = auVar156._8_4_ * auVar24._8_4_ * 0.00012207031 +
                                 auVar81._8_4_ * auVar23._8_4_ * 0.00012207031 +
                                 auVar20._8_4_ * 0.00012207031 * auVar25._8_4_;
                  local_940[3] = auVar156._12_4_ * auVar24._12_4_ * 0.00012207031 +
                                 auVar81._12_4_ * auVar23._12_4_ * 0.00012207031 +
                                 auVar20._12_4_ * 0.00012207031 * auVar25._12_4_;
                  fStack_930 = auVar156._16_4_ * auVar24._16_4_ * 0.00012207031 +
                               auVar81._16_4_ * auVar23._16_4_ * 0.00012207031 +
                               auVar20._16_4_ * 0.00012207031 * auVar25._16_4_;
                  fStack_92c = auVar156._20_4_ * auVar24._20_4_ * 0.00012207031 +
                               auVar81._20_4_ * auVar23._20_4_ * 0.00012207031 +
                               auVar20._20_4_ * 0.00012207031 * auVar25._20_4_;
                  fStack_928 = auVar156._24_4_ * auVar24._24_4_ * 0.00012207031 +
                               auVar81._24_4_ * auVar23._24_4_ * 0.00012207031 +
                               auVar20._24_4_ * 0.00012207031 * auVar25._24_4_;
                  fStack_924 = auVar24._28_4_ + auVar23._28_4_ + auVar25._28_4_;
                  iVar69 = vmovmskps_avx(local_980);
                  uVar63 = CONCAT44((int)((ulong)local_9a0 >> 0x20),iVar69);
                  uVar74 = 0;
                  if (uVar63 != 0) {
                    for (; (uVar63 >> uVar74 & 1) == 0; uVar74 = uVar74 + 1) {
                    }
                  }
                  uVar62 = CONCAT71((int7)(uVar63 >> 8),iVar69 != 0);
                  if (iVar69 != 0) {
                    local_ac0 = vpshufd_avx(ZEXT416(pGVar64->_geomID),0);
                    auStack_ab0 = auVar26._16_16_;
                    local_ae0 = vpshufd_avx(ZEXT416(pGVar64->_primID),0);
                    auStack_ad0 = auVar27._16_16_;
                    auStack_af0 = auVar28._16_16_;
                    local_b00 = *local_be0;
                    auStack_b18 = auVar134._8_24_;
                    local_b20 = pGVar72;
                    local_bc0 = auVar165;
                    local_a00 = auVar163._0_8_;
                    local_9c0 = auVar123._0_8_;
                    local_880 = auVar22;
                    do {
                      uVar76 = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_a60 = *(undefined4 *)(local_960 + uVar74 * 4);
                      fVar77 = local_940[uVar74];
                      local_a50._4_4_ = fVar77;
                      local_a50._0_4_ = fVar77;
                      local_a50._8_4_ = fVar77;
                      local_a50._12_4_ = fVar77;
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_920 + uVar74 * 4);
                      local_b50.context = context->user;
                      local_a90 = *(undefined4 *)(local_900 + uVar74 * 4);
                      uVar1 = *(undefined4 *)(local_8e0 + uVar74 * 4);
                      local_a80._4_4_ = uVar1;
                      local_a80._0_4_ = uVar1;
                      local_a80._8_4_ = uVar1;
                      local_a80._12_4_ = uVar1;
                      uVar1 = *(undefined4 *)(local_8c0 + uVar74 * 4);
                      local_a70._4_4_ = uVar1;
                      local_a70._0_4_ = uVar1;
                      local_a70._8_4_ = uVar1;
                      local_a70._12_4_ = uVar1;
                      local_a40 = local_ae0._0_8_;
                      uStack_a38 = local_ae0._8_8_;
                      local_a30 = local_ac0;
                      vcmpps_avx(ZEXT1632(local_ac0),ZEXT1632(local_ac0),0xf);
                      uStack_a1c = (local_b50.context)->instID[0];
                      local_a20 = uStack_a1c;
                      uStack_a18 = uStack_a1c;
                      uStack_a14 = uStack_a1c;
                      uStack_a10 = (local_b50.context)->instPrimID[0];
                      uStack_a0c = uStack_a10;
                      uStack_a08 = uStack_a10;
                      uStack_a04 = uStack_a10;
                      local_bf0 = local_b00._0_8_;
                      uStack_be8 = local_b00._8_8_;
                      local_b50.valid = (int *)&local_bf0;
                      local_b50.geometryUserPtr = pGVar72->userPtr;
                      local_b50.hit = (RTCHitN *)&local_a90;
                      local_b50.N = 4;
                      local_ba0._0_4_ = (int)uVar62;
                      local_bc0._0_8_ = uVar63;
                      local_b50.ray = (RTCRayN *)ray;
                      uStack_a8c = local_a90;
                      uStack_a88 = local_a90;
                      uStack_a84 = local_a90;
                      uStack_a5c = local_a60;
                      uStack_a58 = local_a60;
                      uStack_a54 = local_a60;
                      if (pGVar72->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar72->occlusionFilterN)(&local_b50);
                        uVar62 = (ulong)(uint)local_ba0._0_4_;
                        pGVar72 = local_b20;
                        uVar63 = local_bc0._0_8_;
                      }
                      auVar58._8_8_ = uStack_be8;
                      auVar58._0_8_ = local_bf0;
                      if (auVar58 == (undefined1  [16])0x0) {
                        auVar123 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar123 = auVar123 ^ _DAT_01febe20;
                      }
                      else {
                        p_Var4 = context->args->filter;
                        if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar72->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var4)(&local_b50);
                          uVar62 = (ulong)(uint)local_ba0._0_4_;
                          pGVar72 = local_b20;
                          uVar63 = local_bc0._0_8_;
                        }
                        auVar59._8_8_ = uStack_be8;
                        auVar59._0_8_ = local_bf0;
                        auVar111 = vpcmpeqd_avx((undefined1  [16])0x0,auVar59);
                        auVar123 = auVar111 ^ _DAT_01febe20;
                        auVar102._8_4_ = 0xff800000;
                        auVar102._0_8_ = 0xff800000ff800000;
                        auVar102._12_4_ = 0xff800000;
                        auVar111 = vblendvps_avx(auVar102,*(undefined1 (*) [16])
                                                           (local_b50.ray + 0x80),auVar111);
                        *(undefined1 (*) [16])(local_b50.ray + 0x80) = auVar111;
                      }
                      auVar92._8_8_ = 0x100000001;
                      auVar92._0_8_ = 0x100000001;
                      if ((auVar92 & auVar123) != (undefined1  [16])0x0) break;
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar76;
                      uVar63 = uVar63 ^ 1L << (uVar74 & 0x3f);
                      uVar74 = 0;
                      if (uVar63 != 0) {
                        for (; (uVar63 >> uVar74 & 1) == 0; uVar74 = uVar74 + 1) {
                        }
                      }
                      uVar62 = CONCAT71((int7)(uVar62 >> 8),uVar63 != 0);
                    } while (uVar63 != 0);
                  }
                }
                goto LAB_00378f92;
              }
            }
            uVar62 = 0;
          }
        }
LAB_00378f92:
        uVar63 = 0;
        uVar74 = local_bd8;
      }
      else {
        pGVar64 = (GridSOA *)(uVar63 & 0xfffffffffffffff0);
        uVar63 = *(ulong *)(pGVar64->data + pGVar64->rootOffset);
        (pre->super_Precalculations).grid = pGVar64;
        uVar62 = 0;
      }
      if ((uVar62 & 1) == 0) {
        uVar71 = 0;
        if (uVar63 != 0) {
          *local_bd0 = uVar63;
          local_bd0 = local_bd0 + 1;
        }
      }
      else {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar71 = 1;
      }
    }
    puVar61 = local_bd0;
  } while ((uVar71 & 3) == 0);
  return local_bc8 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }